

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O0

void __thiscall Acceptor<Client>::Acceptor(Acceptor<Client> *this,int port)

{
  uint16_t uVar1;
  int iVar2;
  undefined8 uVar3;
  string *description;
  uint16_t in_SI;
  IAcceptor<Client> *in_RDI;
  int opt;
  string *in_stack_ffffffffffffff08;
  AcceptException *in_stack_ffffffffffffff10;
  AcceptException *this_00;
  allocator<char> *in_stack_ffffffffffffff30;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff47;
  AcceptException local_91;
  undefined1 local_45;
  allocator<char> local_31 [33];
  undefined4 local_10;
  uint16_t local_c;
  
  local_c = in_SI;
  IAcceptor<Client>::IAcceptor(in_RDI);
  in_RDI->_vptr_IAcceptor = (_func_int **)&PTR_accept_0011b958;
  local_10 = 1;
  *(undefined4 *)((long)&in_RDI[1]._vptr_IAcceptor + 4) = 0x10;
  iVar2 = socket(2,1,0);
  *(int *)&in_RDI[1]._vptr_IAcceptor = iVar2;
  if (iVar2 == 0) {
    local_45 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    __a = local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               (char *)in_RDI,__a);
    AcceptException::AcceptException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_45 = 0;
    __cxa_throw(uVar3,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar2 = setsockopt(*(int *)&in_RDI[1]._vptr_IAcceptor,1,2,&local_10,4);
  if (iVar2 != 0) {
    local_91.description.field_2._M_local_buf[0xf] = '\x01';
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               (char *)in_RDI,in_stack_ffffffffffffff30);
    AcceptException::AcceptException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_91.description.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(uVar3,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  *(undefined2 *)&in_RDI[2]._vptr_IAcceptor = 2;
  *(undefined4 *)((long)&in_RDI[2]._vptr_IAcceptor + 4) = 0;
  uVar1 = htons(local_c);
  *(uint16_t *)((long)&in_RDI[2]._vptr_IAcceptor + 2) = uVar1;
  iVar2 = bind(*(int *)&in_RDI[1]._vptr_IAcceptor,(sockaddr *)(in_RDI + 2),0x10);
  if (iVar2 < 0) {
    description = (string *)__cxa_allocate_exception(0x28);
    this_00 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               (char *)in_RDI,in_stack_ffffffffffffff30);
    AcceptException::AcceptException(this_00,description);
    __cxa_throw(description,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar2 = listen(*(int *)&in_RDI[1]._vptr_IAcceptor,3);
  if (iVar2 < 0) {
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar4,in_stack_ffffffffffffff40)),
               (char *)in_RDI,in_stack_ffffffffffffff30);
    AcceptException::AcceptException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar3,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  return;
}

Assistant:

Acceptor<T>::Acceptor(int port) {
    int opt = 1; 
    addrlen = sizeof(address); 
       
    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) { 
        throw AcceptException("Socket create");
    } 
    if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR, 
                                                  &opt, sizeof(opt))) { 
        throw AcceptException("Set sock opt");
    } 

    address.sin_family = AF_INET; 
    address.sin_addr.s_addr = INADDR_ANY; 
    address.sin_port = htons(port);

    if (bind(server_fd, (struct sockaddr *)&address,  
                                 sizeof(address))<0) { 
        throw AcceptException("Bind failed");
    } 
    if (listen(server_fd, 3) < 0) { 
        throw AcceptException("Listen");
    }  
}